

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::InitGoogleTestImpl<char>(int *argc,char **argv)

{
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **streamable;
  ulong uVar1;
  internal *this;
  string local_58;
  internal *local_38;
  
  if ((DAT_00adb6f0 == g_argvs_abi_cxx11_) && (0 < *argc)) {
    local_38 = (internal *)argv;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&g_argvs_abi_cxx11_,g_argvs_abi_cxx11_);
    if (*argc != 0) {
      uVar1 = 0;
      streamable = extraout_RDX;
      this = local_38;
      do {
        StreamableToString<char*>(&local_58,this,streamable);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &g_argvs_abi_cxx11_,&local_58);
        streamable = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          streamable = extraout_RDX_01;
        }
        uVar1 = uVar1 + 1;
        this = this + 8;
      } while (uVar1 != (uint)*argc);
    }
    ParseGoogleTestFlagsOnlyImpl<char>(argc,(char **)local_38);
    UnitTest::GetInstance();
    UnitTestImpl::PostFlagParsingInit(UnitTest::GetInstance::instance.impl_);
  }
  return;
}

Assistant:

void InitGoogleTestImpl(int* argc, CharType** argv) {
  // We don't want to run the initialization code twice.
  if (GTestIsInitialized()) return;

  if (*argc <= 0) return;

  g_argvs.clear();
  for (int i = 0; i != *argc; i++) {
    g_argvs.push_back(StreamableToString(argv[i]));
  }

  ParseGoogleTestFlagsOnly(argc, argv);
  GetUnitTestImpl()->PostFlagParsingInit();
}